

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

Byte ppmd_read(void *p)

{
  long lVar1;
  Byte *pBVar2;
  Byte b;
  _7zip *zip;
  archive_read *a;
  void *p_local;
  
  lVar1 = *(long *)(*p)[0xf].error_string.length;
  if (*(long *)(lVar1 + 0x4dd0) == 0) {
    archive_set_error(*p,0x54,"Truncated RAR file data");
    *(undefined4 *)(lVar1 + 0x4df8) = 1;
    p_local._7_1_ = '\0';
  }
  else {
    pBVar2 = *(Byte **)(lVar1 + 0x4dc8);
    *(Byte **)(lVar1 + 0x4dc8) = pBVar2 + 1;
    p_local._7_1_ = *pBVar2;
    *(long *)(lVar1 + 0x4dd0) = *(long *)(lVar1 + 0x4dd0) + -1;
    *(long *)(lVar1 + 0x4dd8) = *(long *)(lVar1 + 0x4dd8) + 1;
  }
  return p_local._7_1_;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated RAR file data");
		zip->ppstream.overconsumed = 1;
		return (0);
	}
	b = *zip->ppstream.next_in++;
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	return (b);
}